

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_chart_begin_colored
                  (nk_context *ctx,nk_chart_type type,nk_color color,nk_color highlight,int count,
                  float min_value,float max_value)

{
  int iVar1;
  long lVar2;
  nk_rect r;
  nk_rect rect;
  nk_rect r_00;
  nk_widget_layout_states nVar3;
  undefined4 *puVar4;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  undefined4 in_R8D;
  float in_XMM0_Da;
  float rounding;
  float fVar5;
  float in_XMM1_Da;
  nk_rect nVar6;
  nk_chart_slot *slot;
  nk_rect bounds;
  nk_style_item *background;
  nk_style_chart *style;
  nk_style *config;
  nk_chart *chart;
  nk_window *win;
  nk_size in_stack_ffffffffffffff68;
  void *in_stack_ffffffffffffff70;
  float local_88;
  float local_84;
  undefined1 in_stack_ffffffffffffff88 [16];
  float in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  float in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  nk_bool local_4;
  
  memset(&stack0xffffffffffffffa0,0,0x10);
  if (((in_RDI == 0) || (*(long *)(in_RDI + 0x40d8) == 0)) ||
     (*(long *)(*(long *)(in_RDI + 0x40d8) + 0xa8) == 0)) {
    local_4 = 0;
  }
  else {
    nVar3 = nk_widget((nk_rect *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (nk_context *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    if (nVar3 == NK_WIDGET_INVALID) {
      nk_zero(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      local_4 = 0;
    }
    else {
      lVar2 = *(long *)(*(long *)(in_RDI + 0x40d8) + 0xa8);
      nk_zero(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      *(float *)(lVar2 + 0xfc) = in_stack_ffffffffffffffa0 + *(float *)(in_RDI + 0x12c4);
      *(float *)(lVar2 + 0x100) = in_stack_ffffffffffffffa4 + *(float *)(in_RDI + 0x12c8);
      *(float *)(lVar2 + 0x104) =
           in_stack_ffffffffffffffa8 - (*(float *)(in_RDI + 0x12c4) + *(float *)(in_RDI + 0x12c4));
      *(float *)(lVar2 + 0x108) =
           in_stack_ffffffffffffffac - (*(float *)(in_RDI + 0x12c8) + *(float *)(in_RDI + 0x12c8));
      if (*(float *)(in_RDI + 0x12c4) * 2.0 <= *(float *)(lVar2 + 0x104)) {
        rounding = *(float *)(lVar2 + 0x104);
      }
      else {
        rounding = *(float *)(in_RDI + 0x12c4) * 2.0;
      }
      *(float *)(lVar2 + 0x104) = rounding;
      if (*(float *)(in_RDI + 0x12c8) * 2.0 <= *(float *)(lVar2 + 0x108)) {
        fVar5 = *(float *)(lVar2 + 0x108);
      }
      else {
        fVar5 = *(float *)(in_RDI + 0x12c8) * 2.0;
      }
      *(float *)(lVar2 + 0x108) = fVar5;
      iVar1 = *(int *)(lVar2 + 0xf8);
      *(int *)(lVar2 + 0xf8) = iVar1 + 1;
      puVar4 = (undefined4 *)(lVar2 + 0x10c + (long)iVar1 * 0x28);
      *puVar4 = in_ESI;
      puVar4[6] = in_R8D;
      puVar4[1] = in_EDX;
      puVar4[2] = in_ECX;
      local_84 = in_XMM1_Da;
      if (in_XMM0_Da < in_XMM1_Da) {
        local_84 = in_XMM0_Da;
      }
      puVar4[3] = local_84;
      local_88 = in_XMM0_Da;
      if (in_XMM0_Da < in_XMM1_Da) {
        local_88 = in_XMM1_Da;
      }
      puVar4[4] = local_88;
      puVar4[5] = (float)puVar4[4] - (float)puVar4[3];
      if (*(int *)(in_RDI + 0x1290) == 1) {
        r.w = in_stack_ffffffffffffffa0;
        r._0_8_ = puVar4;
        r.h = in_stack_ffffffffffffffa4;
        nk_draw_image(in_stack_ffffffffffffff88._0_8_,r,(nk_image *)CONCAT44(rounding,fVar5),
                      in_stack_ffffffffffffff88._12_4_);
      }
      else {
        nVar6.w = in_stack_ffffffffffffffa0;
        nVar6._0_8_ = puVar4;
        nVar6.h = in_stack_ffffffffffffffa4;
        nk_fill_rect(in_stack_ffffffffffffff88._0_8_,nVar6,rounding,in_stack_ffffffffffffff88._12_4_
                    );
        r_00.y = in_stack_ffffffffffffffa4;
        r_00.x = in_stack_ffffffffffffffa0;
        r_00.w = in_stack_ffffffffffffffa8;
        r_00.h = in_stack_ffffffffffffffac;
        nVar6 = nk_shrink_rect(r_00,*(float *)(in_RDI + 0x12bc));
        rect.w = in_stack_ffffffffffffffa0;
        rect._0_8_ = puVar4;
        rect.h = in_stack_ffffffffffffffa4;
        nk_fill_rect(nVar6._0_8_,rect,rounding,(nk_color)nVar6.h);
      }
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

NK_API nk_bool
nk_chart_begin_colored(struct nk_context *ctx, enum nk_chart_type type,
struct nk_color color, struct nk_color highlight,
int count, float min_value, float max_value)
{
struct nk_window *win;
struct nk_chart *chart;
const struct nk_style *config;
const struct nk_style_chart *style;

const struct nk_style_item *background;
struct nk_rect bounds = {0, 0, 0, 0};

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);

if (!ctx || !ctx->current || !ctx->current->layout) return 0;
if (!nk_widget(&bounds, ctx)) {
chart = &ctx->current->layout->chart;
nk_zero(chart, sizeof(*chart));
return 0;
}

win = ctx->current;
config = &ctx->style;
chart = &win->layout->chart;
style = &config->chart;

/* setup basic generic chart  */
nk_zero(chart, sizeof(*chart));
chart->x = bounds.x + style->padding.x;
chart->y = bounds.y + style->padding.y;
chart->w = bounds.w - 2 * style->padding.x;
chart->h = bounds.h - 2 * style->padding.y;
chart->w = NK_MAX(chart->w, 2 * style->padding.x);
chart->h = NK_MAX(chart->h, 2 * style->padding.y);

/* add first slot into chart */
{struct nk_chart_slot *slot = &chart->slots[chart->slot++];
slot->type = type;
slot->count = count;
slot->color = color;
slot->highlight = highlight;
slot->min = NK_MIN(min_value, max_value);
slot->max = NK_MAX(min_value, max_value);
slot->range = slot->max - slot->min;}

/* draw chart background */
background = &style->background;
if (background->type == NK_STYLE_ITEM_IMAGE) {
nk_draw_image(&win->buffer, bounds, &background->data.image, nk_white);
} else {
nk_fill_rect(&win->buffer, bounds, style->rounding, style->border_color);
nk_fill_rect(&win->buffer, nk_shrink_rect(bounds, style->border),
style->rounding, style->background.data.color);
}
return 1;
}